

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerGLSL::attempt_emit_loop_header
          (CompilerGLSL *this,SPIRBlock *block,Method method)

{
  uint32_t uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)2> *pTVar3;
  bool bVar4;
  ContinueBlockType CVar5;
  SPIRBlock *pSVar6;
  iterator iVar7;
  CompilerGLSL *pCVar8;
  SPIRBlock *pSVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  BlockID to;
  undefined1 *puVar11;
  long lVar12;
  string initializer;
  string continue_block;
  string condition;
  string local_50;
  
  pSVar6 = Variant::get<spirv_cross::SPIRBlock>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      (block->continue_block).id);
  CVar5 = Compiler::continue_block_type(&this->super_Compiler,pSVar6);
  if ((method & ~MergeToSelectContinueForLoop) != MergeToSelectForLoop) {
    if (method != MergeToDirectForLoop) {
      return false;
    }
    pSVar6 = Variant::get<spirv_cross::SPIRBlock>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        (block->next_block).id);
    sVar2 = (pSVar6->dominated_variables).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
    if (sVar2 != 0) {
      pTVar3 = (pSVar6->dominated_variables).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
      lVar12 = 0;
      do {
        flush_variable_declaration(this,*(uint32_t *)((long)&pTVar3->id + lVar12));
        lVar12 = lVar12 + 4;
      } while (sVar2 << 2 != lVar12);
    }
    uVar1 = this->statement_count;
    emit_block_instructions(this,pSVar6);
    initializer._M_dataplus._M_p._0_4_ = (pSVar6->condition).id;
    iVar7 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->super_Compiler).forced_temporaries._M_h,(key_type *)&initializer);
    if ((iVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) ||
       (uVar1 != this->statement_count)) {
      block->disable_block_optimization = true;
      goto LAB_00215ccd;
    }
    to.id = (pSVar6->true_block).id;
    if (CVar5 == WhileLoop) {
      emit_while_loop_initializers(this,block);
      (*(this->super_Compiler)._vptr_Compiler[0x35])(this,block);
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      to_expression_abi_cxx11_(&initializer,this,(pSVar6->condition).id,true);
      pCVar8 = (CompilerGLSL *)
               Variant::get<spirv_cross::SPIRBlock>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (pSVar6->true_block).id);
      pSVar9 = Variant::get<spirv_cross::SPIRBlock>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (block->merge_block).id);
      bVar4 = Compiler::execution_is_noop(&this->super_Compiler,(SPIRBlock *)pCVar8,pSVar9);
      if (bVar4) {
        enclose_expression(&continue_block,pCVar8,&initializer);
        join<char_const(&)[2],std::__cxx11::string>
                  (&condition,(spirv_cross *)0x3589eb,(char (*) [2])&continue_block,pbVar10);
        ::std::__cxx11::string::operator=((string *)&initializer,(string *)&condition);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)condition._M_dataplus._M_p != &condition.field_2) {
          operator_delete(condition._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)continue_block._M_dataplus._M_p != &continue_block.field_2) {
          operator_delete(continue_block._M_dataplus._M_p);
        }
        to.id = (pSVar6->false_block).id;
      }
      statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                (this,(char (*) [8])"while (",&initializer,(char (*) [2])0x3452a8);
      puVar11 = (undefined1 *)
                CONCAT44(initializer._M_dataplus._M_p._4_4_,(uint32_t)initializer._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11 == &initializer.field_2) goto LAB_00215f0a;
    }
    else {
      if (CVar5 != ForLoop) goto LAB_00215cb7;
      emit_for_loop_initializers_abi_cxx11_(&initializer,this,block);
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      to_expression_abi_cxx11_(&condition,this,(pSVar6->condition).id,true);
      pCVar8 = (CompilerGLSL *)
               Variant::get<spirv_cross::SPIRBlock>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (pSVar6->true_block).id);
      pSVar9 = Variant::get<spirv_cross::SPIRBlock>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (block->merge_block).id);
      bVar4 = Compiler::execution_is_noop(&this->super_Compiler,(SPIRBlock *)pCVar8,pSVar9);
      if (bVar4) {
        enclose_expression(&local_50,pCVar8,&condition);
        join<char_const(&)[2],std::__cxx11::string>
                  (&continue_block,(spirv_cross *)0x3589eb,(char (*) [2])&local_50,pbVar10);
        ::std::__cxx11::string::operator=((string *)&condition,(string *)&continue_block);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)continue_block._M_dataplus._M_p != &continue_block.field_2) {
          operator_delete(continue_block._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        to.id = (pSVar6->false_block).id;
      }
      emit_continue_block_abi_cxx11_(&continue_block,this,(block->continue_block).id,false,false);
      (*(this->super_Compiler)._vptr_Compiler[0x35])(this,block);
      statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                (this,(char (*) [6])"for (",&initializer,(char (*) [3])0x3499de,&condition,
                 (char (*) [3])0x3499de,&continue_block,(char (*) [2])0x3452a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)continue_block._M_dataplus._M_p != &continue_block.field_2) {
        operator_delete(continue_block._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)condition._M_dataplus._M_p != &condition.field_2) {
        operator_delete(condition._M_dataplus._M_p);
      }
      puVar11 = (undefined1 *)
                CONCAT44(initializer._M_dataplus._M_p._4_4_,(uint32_t)initializer._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11 == &initializer.field_2) goto LAB_00215f0a;
    }
    operator_delete(puVar11);
LAB_00215f0a:
    statement<char_const(&)[2]>(this,(char (*) [2])0x34a43e);
    this->indent = this->indent + 1;
    branch(this,(BlockID)(pSVar6->super_IVariant).self.id,to);
    return true;
  }
  uVar1 = this->statement_count;
  emit_block_instructions(this,block);
  initializer._M_dataplus._M_p._0_4_ = (block->condition).id;
  iVar7 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->super_Compiler).forced_temporaries._M_h,(key_type *)&initializer);
  if ((iVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) &&
     (uVar1 == this->statement_count)) {
    if (CVar5 == WhileLoop) {
      sVar2 = (block->dominated_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
      if (sVar2 != 0) {
        pTVar3 = (block->dominated_variables).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
        lVar12 = 0;
        do {
          flush_variable_declaration(this,*(uint32_t *)((long)&pTVar3->id + lVar12));
          lVar12 = lVar12 + 4;
        } while (sVar2 << 2 != lVar12);
      }
      emit_while_loop_initializers(this,block);
      (*(this->super_Compiler)._vptr_Compiler[0x35])(this,block);
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      to_expression_abi_cxx11_(&initializer,this,(block->condition).id,true);
      pCVar8 = (CompilerGLSL *)
               Variant::get<spirv_cross::SPIRBlock>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (block->true_block).id);
      pSVar6 = Variant::get<spirv_cross::SPIRBlock>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (block->merge_block).id);
      bVar4 = Compiler::execution_is_noop(&this->super_Compiler,(SPIRBlock *)pCVar8,pSVar6);
      if (bVar4) {
        enclose_expression(&continue_block,pCVar8,&initializer);
        join<char_const(&)[2],std::__cxx11::string>
                  (&condition,(spirv_cross *)0x3589eb,(char (*) [2])&continue_block,pbVar10);
        ::std::__cxx11::string::operator=((string *)&initializer,(string *)&condition);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)condition._M_dataplus._M_p != &condition.field_2) {
          operator_delete(condition._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)continue_block._M_dataplus._M_p != &continue_block.field_2) {
          operator_delete(continue_block._M_dataplus._M_p);
        }
      }
      statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                (this,(char (*) [8])"while (",&initializer,(char (*) [2])0x3452a8);
      puVar11 = (undefined1 *)
                CONCAT44(initializer._M_dataplus._M_p._4_4_,(uint32_t)initializer._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11 == &initializer.field_2) goto LAB_00215fb3;
    }
    else {
      if (CVar5 != ForLoop) goto LAB_00215cb7;
      sVar2 = (block->dominated_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
      if (sVar2 != 0) {
        pTVar3 = (block->dominated_variables).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
        lVar12 = 0;
        do {
          flush_variable_declaration(this,*(uint32_t *)((long)&pTVar3->id + lVar12));
          lVar12 = lVar12 + 4;
        } while (sVar2 << 2 != lVar12);
      }
      emit_for_loop_initializers_abi_cxx11_(&initializer,this,block);
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      to_expression_abi_cxx11_(&condition,this,(block->condition).id,true);
      pCVar8 = (CompilerGLSL *)
               Variant::get<spirv_cross::SPIRBlock>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (block->true_block).id);
      pSVar6 = Variant::get<spirv_cross::SPIRBlock>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (block->merge_block).id);
      bVar4 = Compiler::execution_is_noop(&this->super_Compiler,(SPIRBlock *)pCVar8,pSVar6);
      if (bVar4) {
        enclose_expression(&local_50,pCVar8,&condition);
        join<char_const(&)[2],std::__cxx11::string>
                  (&continue_block,(spirv_cross *)0x3589eb,(char (*) [2])&local_50,pbVar10);
        ::std::__cxx11::string::operator=((string *)&condition,(string *)&continue_block);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)continue_block._M_dataplus._M_p != &continue_block.field_2) {
          operator_delete(continue_block._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      (*(this->super_Compiler)._vptr_Compiler[0x35])(this,block);
      if (method == MergeToSelectContinueForLoop) {
        statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
                  (this,(char (*) [6])"for (",&initializer,(char (*) [3])0x3499de,&condition,
                   (char (*) [4])"; )");
      }
      else {
        emit_continue_block_abi_cxx11_(&continue_block,this,(block->continue_block).id,false,false);
        statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                  (this,(char (*) [6])"for (",&initializer,(char (*) [3])0x3499de,&condition,
                   (char (*) [3])0x3499de,&continue_block,(char (*) [2])0x3452a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)continue_block._M_dataplus._M_p != &continue_block.field_2) {
          operator_delete(continue_block._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)condition._M_dataplus._M_p != &condition.field_2) {
        operator_delete(condition._M_dataplus._M_p);
      }
      puVar11 = (undefined1 *)
                CONCAT44(initializer._M_dataplus._M_p._4_4_,(uint32_t)initializer._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11 == &initializer.field_2) goto LAB_00215fb3;
    }
    operator_delete(puVar11);
LAB_00215fb3:
    statement<char_const(&)[2]>(this,(char (*) [2])0x34a43e);
    this->indent = this->indent + 1;
    return true;
  }
LAB_00215cb7:
  block->disable_block_optimization = true;
LAB_00215ccd:
  Compiler::force_recompile(&this->super_Compiler);
  statement<char_const(&)[2]>(this,(char (*) [2])0x34a43e);
  this->indent = this->indent + 1;
  return false;
}

Assistant:

bool CompilerGLSL::attempt_emit_loop_header(SPIRBlock &block, SPIRBlock::Method method)
{
	SPIRBlock::ContinueBlockType continue_type = continue_block_type(get<SPIRBlock>(block.continue_block));

	if (method == SPIRBlock::MergeToSelectForLoop || method == SPIRBlock::MergeToSelectContinueForLoop)
	{
		uint32_t current_count = statement_count;
		// If we're trying to create a true for loop,
		// we need to make sure that all opcodes before branch statement do not actually emit any code.
		// We can then take the condition expression and create a for (; cond ; ) { body; } structure instead.
		emit_block_instructions(block);

		bool condition_is_temporary = forced_temporaries.find(block.condition) == end(forced_temporaries);

		// This can work! We only did trivial things which could be forwarded in block body!
		if (current_count == statement_count && condition_is_temporary)
		{
			switch (continue_type)
			{
			case SPIRBlock::ForLoop:
			{
				// This block may be a dominating block, so make sure we flush undeclared variables before building the for loop header.
				flush_undeclared_variables(block);

				// Important that we do this in this order because
				// emitting the continue block can invalidate the condition expression.
				auto initializer = emit_for_loop_initializers(block);
				auto condition = to_expression(block.condition);

				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(block.true_block), get<SPIRBlock>(block.merge_block)))
					condition = join("!", enclose_expression(condition));

				emit_block_hints(block);
				if (method != SPIRBlock::MergeToSelectContinueForLoop)
				{
					auto continue_block = emit_continue_block(block.continue_block, false, false);
					statement("for (", initializer, "; ", condition, "; ", continue_block, ")");
				}
				else
					statement("for (", initializer, "; ", condition, "; )");
				break;
			}

			case SPIRBlock::WhileLoop:
			{
				// This block may be a dominating block, so make sure we flush undeclared variables before building the while loop header.
				flush_undeclared_variables(block);
				emit_while_loop_initializers(block);
				emit_block_hints(block);

				auto condition = to_expression(block.condition);
				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(block.true_block), get<SPIRBlock>(block.merge_block)))
					condition = join("!", enclose_expression(condition));

				statement("while (", condition, ")");
				break;
			}

			default:
				block.disable_block_optimization = true;
				force_recompile();
				begin_scope(); // We'll see an end_scope() later.
				return false;
			}

			begin_scope();
			return true;
		}
		else
		{
			block.disable_block_optimization = true;
			force_recompile();
			begin_scope(); // We'll see an end_scope() later.
			return false;
		}
	}
	else if (method == SPIRBlock::MergeToDirectForLoop)
	{
		auto &child = get<SPIRBlock>(block.next_block);

		// This block may be a dominating block, so make sure we flush undeclared variables before building the for loop header.
		flush_undeclared_variables(child);

		uint32_t current_count = statement_count;

		// If we're trying to create a true for loop,
		// we need to make sure that all opcodes before branch statement do not actually emit any code.
		// We can then take the condition expression and create a for (; cond ; ) { body; } structure instead.
		emit_block_instructions(child);

		bool condition_is_temporary = forced_temporaries.find(child.condition) == end(forced_temporaries);

		if (current_count == statement_count && condition_is_temporary)
		{
			uint32_t target_block = child.true_block;

			switch (continue_type)
			{
			case SPIRBlock::ForLoop:
			{
				// Important that we do this in this order because
				// emitting the continue block can invalidate the condition expression.
				auto initializer = emit_for_loop_initializers(block);
				auto condition = to_expression(child.condition);

				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(child.true_block), get<SPIRBlock>(block.merge_block)))
				{
					condition = join("!", enclose_expression(condition));
					target_block = child.false_block;
				}

				auto continue_block = emit_continue_block(block.continue_block, false, false);
				emit_block_hints(block);
				statement("for (", initializer, "; ", condition, "; ", continue_block, ")");
				break;
			}

			case SPIRBlock::WhileLoop:
			{
				emit_while_loop_initializers(block);
				emit_block_hints(block);

				auto condition = to_expression(child.condition);
				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(child.true_block), get<SPIRBlock>(block.merge_block)))
				{
					condition = join("!", enclose_expression(condition));
					target_block = child.false_block;
				}

				statement("while (", condition, ")");
				break;
			}

			default:
				block.disable_block_optimization = true;
				force_recompile();
				begin_scope(); // We'll see an end_scope() later.
				return false;
			}

			begin_scope();
			branch(child.self, target_block);
			return true;
		}
		else
		{
			block.disable_block_optimization = true;
			force_recompile();
			begin_scope(); // We'll see an end_scope() later.
			return false;
		}
	}
	else
		return false;
}